

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reoTransfer.c
# Opt level: O2

DdNode * reoTransferUnitsToNodes_rec(reo_man *p,reo_unit *pUnit)

{
  int *piVar1;
  DdManager *unique;
  reo_hash *prVar2;
  reo_unit *n;
  DdNode *T;
  ulong uVar3;
  ulong uVar4;
  DdNode *pDVar5;
  ulong uVar6;
  int iVar7;
  reo_unit *prVar8;
  
  unique = p->dd;
  uVar4 = (ulong)((uint)pUnit & 1);
  prVar8 = (reo_unit *)((ulong)pUnit & 0xfffffffffffffffe);
  if (prVar8->n == 1) {
    uVar3 = 0xffffffffffffffff;
  }
  else {
    uVar3 = (ulong)((long)prVar8 * 0xc00005 + (long)p->Signature) % (ulong)(long)p->nTableSize;
    prVar2 = p->HTable;
    while( true ) {
      iVar7 = (int)uVar3;
      if (prVar2[iVar7].Sign != p->Signature) break;
      if (prVar2[iVar7].Arg1 == prVar8) {
        if (prVar2[iVar7].Arg2 != (reo_unit *)0x0) {
          return (DdNode *)(uVar4 ^ (ulong)prVar2[iVar7].Arg2);
        }
        __assert_fail("bRes",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/reo/reoTransfer.c"
                      ,0x89,"DdNode *reoTransferUnitsToNodes_rec(reo_man *, reo_unit *)");
      }
      uVar3 = (long)(iVar7 + 1) % (long)p->nTableSize & 0xffffffff;
    }
  }
  if (prVar8->lev == 30000) {
    n = (reo_unit *)cuddUniqueConst(unique,(double)(int)prVar8->pE);
    uVar6 = (ulong)n & 0xfffffffffffffffe;
    iVar7 = 1;
LAB_00655dba:
    *(int *)(uVar6 + 4) = *(int *)(uVar6 + 4) + iVar7;
    if (prVar8->n != 1) {
      prVar2 = p->HTable;
      while( true ) {
        iVar7 = (int)uVar3;
        if (prVar2[iVar7].Sign != p->Signature) break;
        uVar3 = (long)(iVar7 + 1) % (long)p->nTableSize & 0xffffffff;
      }
      prVar2[iVar7].Sign = p->Signature;
      prVar2[iVar7].Arg1 = prVar8;
      prVar2[iVar7].Arg2 = n;
      iVar7 = p->nRefNodes;
      p->nRefNodes = iVar7 + 1;
      p->pRefNodes[iVar7] = (DdNode *)n;
      Cudd_Ref((DdNode *)n);
    }
    p->nNodesCur = p->nNodesCur + 1;
    pDVar5 = (DdNode *)(uVar4 ^ (ulong)n);
    piVar1 = (int *)(((ulong)n & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + -1;
  }
  else {
    pDVar5 = reoTransferUnitsToNodes_rec(p,prVar8->pE);
    if (pDVar5 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      T = reoTransferUnitsToNodes_rec(p,prVar8->pT);
      if (T != (DdNode *)0x0) {
        uVar6 = (ulong)T & 0xfffffffffffffffe;
        *(int *)(uVar6 + 4) = *(int *)(uVar6 + 4) + 1;
        if (pDVar5 == T) {
          __assert_fail("E != T",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/reo/reoTransfer.c"
                        ,0xa5,"DdNode *reoTransferUnitsToNodes_rec(reo_man *, reo_unit *)");
        }
        if (((ulong)T & 1) != 0) {
          __assert_fail("!Cudd_IsComplement(T)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/reo/reoTransfer.c"
                        ,0xa6,"DdNode *reoTransferUnitsToNodes_rec(reo_man *, reo_unit *)");
        }
        n = (reo_unit *)cuddUniqueInter(unique,p->pMapToDdVarsFinal[prVar8->lev],T,pDVar5);
        if (n != (reo_unit *)0x0) {
          piVar1 = (int *)(((ulong)n & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          iVar7 = -1;
          goto LAB_00655dba;
        }
        Cudd_RecursiveDeref(unique,pDVar5);
        pDVar5 = T;
      }
      Cudd_RecursiveDeref(unique,pDVar5);
    }
    pDVar5 = (DdNode *)0x0;
  }
  return pDVar5;
}

Assistant:

DdNode * reoTransferUnitsToNodes_rec( reo_man * p, reo_unit * pUnit )
{
	DdManager * dd = p->dd;
	DdNode * bRes, * E, * T;
	int HKey = -1; // Suppress "might be used uninitialized"
        int fComp;

	fComp = Cudd_IsComplement(pUnit);
	pUnit = Unit_Regular(pUnit);

	// check the hash-table
	if ( pUnit->n != 1 )
	{
		for ( HKey = hashKey2(p->Signature,pUnit,p->nTableSize); p->HTable[HKey].Sign == p->Signature; HKey = (HKey+1) % p->nTableSize )
			if ( p->HTable[HKey].Arg1 == pUnit )
			{
				bRes = (DdNode*) p->HTable[HKey].Arg2;  
				assert( bRes );
				return Cudd_NotCond( bRes, fComp );
			}
	}

	// treat the case of constants
	if ( Unit_IsConstant(pUnit) )
	{
		bRes = cuddUniqueConst( dd, ((double)((int)(ABC_PTRUINT_T)(pUnit->pE))) );
		cuddRef( bRes );
	}
	else
	{
		// split and recur on children of this node
		E = reoTransferUnitsToNodes_rec( p, pUnit->pE );
		if ( E == NULL )
			return NULL;
		cuddRef(E);

		T = reoTransferUnitsToNodes_rec( p, pUnit->pT );
		if ( T == NULL )
		{
			Cudd_RecursiveDeref(dd, E);
			return NULL;
		}
		cuddRef(T);
		
		// consider the case when Res0 and Res1 are the same node
		assert( E != T );
		assert( !Cudd_IsComplement(T) );

		bRes = cuddUniqueInter( dd, p->pMapToDdVarsFinal[pUnit->lev], T, E );
		if ( bRes == NULL ) 
		{
			Cudd_RecursiveDeref(dd,E);
			Cudd_RecursiveDeref(dd,T);
			return NULL;
		}
		cuddRef( bRes );
		cuddDeref( E );
		cuddDeref( T );
	}

	// do not keep the result if the ref count is only 1, since it will not be visited again
	if ( pUnit->n != 1 )
	{
		 // while we traversed the diagram, the hash entry to which HKey points,
		 // might have been used. Make sure that its signature is different.
		 for ( ; p->HTable[HKey].Sign == p->Signature; HKey = (HKey+1) % p->nTableSize );
		 p->HTable[HKey].Sign = p->Signature;
		 p->HTable[HKey].Arg1 = pUnit;
		 p->HTable[HKey].Arg2 = (reo_unit *)bRes;  

		 // add the DD to the referenced DD list in order to be able to store it in cache
		 p->pRefNodes[p->nRefNodes++] = bRes;  Cudd_Ref( bRes ); 
		 // no need to do this, because the garbage collection will not take bRes away
		 // it is held by the diagram in the making
	}
	// increment the counter of nodes
	p->nNodesCur++;
	cuddDeref( bRes );
	return Cudd_NotCond( bRes, fComp );
}